

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cpp
# Opt level: O1

void __thiscall
clickhouse::ColumnTuple::ColumnTuple
          (ColumnTuple *this,
          vector<std::shared_ptr<clickhouse::Column>,_std::allocator<std::shared_ptr<clickhouse::Column>_>_>
          *columns)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer psVar2;
  element_type *peVar3;
  pointer psVar4;
  shared_ptr<clickhouse::Type> local_78;
  vector<std::shared_ptr<clickhouse::Type>,_std::allocator<std::shared_ptr<clickhouse::Type>_>_>
  local_68;
  vector<std::shared_ptr<clickhouse::Column>,_std::allocator<std::shared_ptr<clickhouse::Column>_>_>
  *local_48;
  element_type *local_40;
  anon_union_8_7_39536558_for_Type_2 local_38;
  
  local_68.
  super__Vector_base<std::shared_ptr<clickhouse::Type>,_std::allocator<std::shared_ptr<clickhouse::Type>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<clickhouse::Type>,_std::allocator<std::shared_ptr<clickhouse::Type>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<clickhouse::Type>,_std::allocator<std::shared_ptr<clickhouse::Type>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar4 = (columns->
           super__Vector_base<std::shared_ptr<clickhouse::Column>,_std::allocator<std::shared_ptr<clickhouse::Column>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (columns->
           super__Vector_base<std::shared_ptr<clickhouse::Column>,_std::allocator<std::shared_ptr<clickhouse::Column>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_48 = columns;
  if (psVar4 != psVar2) {
    do {
      peVar3 = (psVar4->super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_78.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (peVar3->type_).super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (peVar3->type_).super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_78.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_78.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_78.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_78.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_78.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      std::
      vector<std::shared_ptr<clickhouse::Type>,std::allocator<std::shared_ptr<clickhouse::Type>>>::
      emplace_back<std::shared_ptr<clickhouse::Type>>
                ((vector<std::shared_ptr<clickhouse::Type>,std::allocator<std::shared_ptr<clickhouse::Type>>>
                  *)&local_68,&local_78);
      if (local_78.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      psVar4 = psVar4 + 1;
    } while (psVar4 != psVar2);
  }
  Type::CreateTuple((Type *)&local_40,&local_68);
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__Column_0016b560;
  (this->super_Column).type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_40;
  (this->super_Column).type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.array_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &((local_38.array_)->item_type).
                super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var1 = &((local_38.array_)->item_type).
                super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.array_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.array_);
  }
  std::
  vector<std::shared_ptr<clickhouse::Type>,_std::allocator<std::shared_ptr<clickhouse::Type>_>_>::
  ~vector(&local_68);
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__ColumnTuple_0016c878;
  std::
  vector<std::shared_ptr<clickhouse::Column>,_std::allocator<std::shared_ptr<clickhouse::Column>_>_>
  ::vector(&this->columns_,local_48);
  return;
}

Assistant:

ColumnTuple::ColumnTuple(const std::vector<ColumnRef>& columns)
    : Column(Type::CreateTuple(CollectTypes(columns)))
    , columns_(columns)
{
}